

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::_q_closeTab(QMdiAreaPrivate *this,int index)

{
  QWidget *this_00;
  int in_ESI;
  QMdiSubWindow *subWindow;
  qsizetype in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  QList<QPointer<QMdiSubWindow>_>::at
            ((QList<QPointer<QMdiSubWindow>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8);
  this_00 = &::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x60ef7f)->
             super_QWidget;
  QWidget::close(this_00,in_ESI);
  return;
}

Assistant:

void QMdiAreaPrivate::_q_closeTab(int index)
{
#if !QT_CONFIG(tabbar)
    Q_UNUSED(index);
#else
    QMdiSubWindow *subWindow = childWindows.at(index);
    Q_ASSERT(subWindow);
    subWindow->close();
#endif // QT_CONFIG(tabbar)
}